

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::Expected(DataParser *this,char expected)

{
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char local_11;
  DataParser *pDStack_10;
  char expected_local;
  DataParser *this_local;
  
  local_11 = expected;
  pDStack_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,1,'\'',&local_79);
  ::std::operator+(&local_58,&local_78,local_11);
  ::std::operator+(&local_38,&local_58,'\'');
  Expected(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void Expected(char expected) { Expected(String(1, '\'') + expected + '\''); }